

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sessionwidget.cpp
# Opt level: O0

void __thiscall SessionWidget::~SessionWidget(SessionWidget *this)

{
  QThread *pQVar1;
  QDeadlineTimer local_20;
  SessionWidget *local_10;
  SessionWidget *this_local;
  
  *(undefined ***)this = &PTR_metaObject_002330f0;
  *(undefined **)&this->field_0x10 = &DAT_002332a0;
  this->mCancel = true;
  local_10 = this;
  if (this->mThread != (QThread *)0x0) {
    QThread::quit();
    pQVar1 = this->mThread;
    QDeadlineTimer::QDeadlineTimer(&local_20,Forever,CoarseTimer);
    QThread::wait((QDeadlineTimer *)pQVar1);
  }
  if (this->mThread != (QThread *)0x0) {
    (**(code **)(*(long *)this->mThread + 0x20))();
  }
  this->mThread = (QThread *)0x0;
  if (this->ui != (SessionWidget *)0x0) {
    operator_delete(this->ui,0x58);
  }
  QMap<QString,_QList<QString>_>::~QMap(&this->mAllFiles);
  QSet<int>::~QSet(&this->mCanceled);
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

SessionWidget::~SessionWidget()
{
    mCancel = true;
    if (mThread) {
        mThread->quit();
        mThread->wait();
    }
    delete mThread;
    mThread = nullptr;
    delete ui;
}